

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cstring.cpp
# Opt level: O0

char * T_CString_toLowerCase_63(char *str)

{
  char cVar1;
  char *origPtr;
  char *str_local;
  
  origPtr = str;
  if (str != (char *)0x0) {
    do {
      cVar1 = uprv_asciitolower_63(*origPtr);
      *origPtr = cVar1;
      cVar1 = *origPtr;
      origPtr = origPtr + 1;
    } while (cVar1 != '\0');
  }
  return str;
}

Assistant:

U_CAPI char* U_EXPORT2
T_CString_toLowerCase(char* str)
{
    char* origPtr = str;

    if (str) {
        do
            *str = (char)uprv_tolower(*str);
        while (*(str++));
    }

    return origPtr;
}